

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddDefaultValue(Parse *pParse,Expr *pExpr,char *zStart,char *zEnd)

{
  short sVar1;
  sqlite3 *db;
  Table *pTVar2;
  Column *pCVar3;
  Expr *pEVar4;
  Expr x;
  undefined1 local_78 [40];
  anon_union_8_14_c5524298_for_u aStack_50;
  undefined8 local_48;
  AggInfo *pAStack_40;
  anon_union_8_2_31fbcc88_for_y local_38;
  
  db = pParse->db;
  pTVar2 = pParse->pNewTable;
  if (pTVar2 != (Table *)0x0) {
    sVar1 = pTVar2->nCol;
    pCVar3 = pTVar2->aCol;
    local_78[0x24] = (db->init).busy + '\x04';
    local_78._8_8_ = exprNodeIsConstant;
    local_78._16_8_ = sqlite3SelectWalkFail;
    aStack_50.pNC = aStack_50.pNC & 0xffffffff00000000;
    if (pExpr != (Expr *)0x0) {
      walkExpr((Walker *)local_78,pExpr);
    }
    if (local_78[0x24] == '\0') {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",
                      pCVar3[(long)sVar1 + -1].zName);
    }
    else {
      if (pCVar3[(long)sVar1 + -1].pDflt != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,pCVar3[(long)sVar1 + -1].pDflt);
      }
      local_78._8_8_ = (_func_int_Walker_ptr_Expr_ptr *)0x0;
      local_48._0_2_ = 0;
      local_48._2_2_ = 0;
      local_48._4_2_ = 0;
      local_48._6_1_ = '\0';
      local_48._7_1_ = 0;
      pAStack_40 = (AggInfo *)0x0;
      local_78._32_8_ = (ExprList *)0x0;
      aStack_50.pNC = (NameContext *)0x0;
      local_78._16_8_ = (Expr *)0x0;
      local_78._24_8_ = (Expr *)0x0;
      local_38.pTab = (Table *)0x0;
      local_78._0_8_ = (Parse *)0xa9;
      local_78._8_8_ = sqlite3DbSpanDup(db,zStart,zEnd);
      local_78._4_4_ = 0x1000;
      local_78._16_8_ = pExpr;
      pEVar4 = exprDup(db,(Expr *)local_78,1,(u8 **)0x0);
      pCVar3[(long)sVar1 + -1].pDflt = pEVar4;
      if ((_func_int_Walker_ptr_Expr_ptr *)local_78._8_8_ != (_func_int_Walker_ptr_Expr_ptr *)0x0) {
        sqlite3DbFreeNN(db,(void *)local_78._8_8_);
      }
    }
  }
  if (1 < pParse->eParseMode) {
    local_78._32_8_ = (ExprList *)0x0;
    aStack_50.pNC = (NameContext *)0x0;
    local_78._16_8_ = (Expr *)0x0;
    local_78._24_8_ = (Expr *)0x0;
    local_78._8_8_ = renameUnmapExprCb;
    local_78._0_8_ = pParse;
    if (pExpr != (Expr *)0x0) {
      walkExpr((Walker *)local_78,pExpr);
    }
  }
  if (pExpr != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pExpr);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(
  Parse *pParse,           /* Parsing context */
  Expr *pExpr,             /* The parsed expression of the default value */
  const char *zStart,      /* Start of the default value text */
  const char *zEnd         /* First character past end of defaut value text */
){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pExpr, db->init.busy) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zName);
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory.
      */
      Expr x;
      sqlite3ExprDelete(db, pCol->pDflt);
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbSpanDup(db, zStart, zEnd);
      x.pLeft = pExpr;
      x.flags = EP_Skip;
      pCol->pDflt = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
    }
  }
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprUnmap(pParse, pExpr);
  }
  sqlite3ExprDelete(db, pExpr);
}